

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleFans.cpp
# Opt level: O1

O3DGCErrorCode __thiscall
o3dgc::CompressedTriangleFans::SaveUIntAC
          (CompressedTriangleFans *this,Vector<long> *data,unsigned_long M,BinaryStream *bstream)

{
  unsigned_long value;
  uchar *puVar1;
  unsigned_long uVar2;
  long lVar3;
  unsigned_long position;
  unsigned_long uVar4;
  unsigned_long value_00;
  uint uVar5;
  CompressedTriangleFans *pCVar6;
  ulong uVar7;
  Arithmetic_Codec ace;
  Adaptive_Data_Model mModelValues;
  uchar local_b9;
  unsigned_long local_b8;
  CompressedTriangleFans *local_b0;
  BinaryStream *local_a8;
  unsigned_long local_a0;
  Arithmetic_Codec local_98;
  Adaptive_Data_Model local_68;
  
  position = (bstream->m_stream).m_size;
  value = data->m_size;
  local_b0 = this;
  BinaryStream::WriteUInt32Bin(bstream,0);
  BinaryStream::WriteUInt32Bin(bstream,value);
  if (value != 0) {
    uVar5 = (int)value * 8 + 100;
    uVar2 = 0;
    uVar4 = 0x7fffffff;
    do {
      value_00 = data->m_buffer[uVar2];
      if ((long)uVar4 < data->m_buffer[uVar2]) {
        value_00 = uVar4;
      }
      uVar2 = uVar2 + 1;
      uVar4 = value_00;
    } while (value != uVar2);
    local_a8 = bstream;
    local_a0 = M;
    BinaryStream::WriteUInt32Bin(bstream,value_00);
    local_b8 = CONCAT44(local_b8._4_4_,uVar5);
    uVar7 = (ulong)uVar5;
    pCVar6 = local_b0;
    if (local_b0->m_sizeBufferAC < uVar7) {
      if (local_b0->m_bufferAC != (uchar *)0x0) {
        operator_delete__(local_b0->m_bufferAC);
      }
      pCVar6 = local_b0;
      local_b0->m_sizeBufferAC = uVar7;
      puVar1 = (uchar *)operator_new__(uVar7);
      pCVar6->m_bufferAC = puVar1;
    }
    Arithmetic_Codec::Arithmetic_Codec(&local_98);
    Arithmetic_Codec::set_buffer(&local_98,(uint)local_b8,pCVar6->m_bufferAC);
    Arithmetic_Codec::start_encoder(&local_98);
    local_b8 = position;
    Adaptive_Data_Model::Adaptive_Data_Model(&local_68,(int)local_a0 + 1);
    lVar3 = 0;
    do {
      Arithmetic_Codec::encode(&local_98,(int)data->m_buffer[lVar3] - (int)value_00,&local_68);
      lVar3 = lVar3 + 1;
    } while (value + (value == 0) != lVar3);
    uVar5 = Arithmetic_Codec::stop_encoder(&local_98);
    bstream = local_a8;
    pCVar6 = local_b0;
    if (uVar5 != 0) {
      uVar7 = 0;
      do {
        local_b9 = pCVar6->m_bufferAC[uVar7];
        Vector<unsigned_char>::PushBack(&bstream->m_stream,&local_b9);
        uVar7 = uVar7 + 1;
      } while (uVar5 != uVar7);
    }
    Adaptive_Data_Model::~Adaptive_Data_Model(&local_68);
    Arithmetic_Codec::~Arithmetic_Codec(&local_98);
    position = local_b8;
  }
  BinaryStream::WriteUInt32Bin(bstream,position,(bstream->m_stream).m_size - position);
  return O3DGC_OK;
}

Assistant:

O3DGCErrorCode    CompressedTriangleFans::SaveUIntAC(const Vector<long> & data,
                                                         const unsigned long M,
                                                         BinaryStream & bstream) 
    {
        unsigned long start = bstream.GetSize();     
        const unsigned int NMAX = data.GetSize() * 8 + 100;
        const unsigned long size       = data.GetSize();
        long minValue = O3DGC_MAX_LONG;
        bstream.WriteUInt32Bin(0);
        bstream.WriteUInt32Bin(size);
        if (size > 0)
        {
    #ifdef DEBUG_VERBOSE
            printf("-----------\nsize %i, start %i\n", size, start);
            fprintf(g_fileDebugTF, "-----------\nsize %i, start %i\n", size, start);
    #endif //DEBUG_VERBOSE

            for(unsigned long i = 0; i < size; ++i)
            {
                if (minValue > data[i]) 
                {
                    minValue = data[i];
                }
    #ifdef DEBUG_VERBOSE
                printf("%i\t%i\n", i, data[i]);
                fprintf(g_fileDebugTF, "%i\t%i\n", i, data[i]);
    #endif //DEBUG_VERBOSE
            }
            bstream.WriteUInt32Bin(minValue);
            if ( m_sizeBufferAC < NMAX )
            {
                delete [] m_bufferAC;
                m_sizeBufferAC = NMAX;
                m_bufferAC     = new unsigned char [m_sizeBufferAC];
            }
            Arithmetic_Codec ace;
            ace.set_buffer(NMAX, m_bufferAC);
            ace.start_encoder();
            Adaptive_Data_Model mModelValues(M+1);
            for(unsigned long i = 0; i < size; ++i)
            {
                ace.encode(data[i]-minValue, mModelValues);
            }
            unsigned long encodedBytes = ace.stop_encoder();
            for(unsigned long i = 0; i < encodedBytes; ++i)
            {
                bstream.WriteUChar8Bin(m_bufferAC[i]);
            }
        }
        bstream.WriteUInt32Bin(start, bstream.GetSize() - start);
        return O3DGC_OK;
    }